

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 soft_f32_addsub(float32 a,float32 b,_Bool subtract,float_status *status)

{
  FloatParts b_00;
  FloatParts a_00;
  FloatParts a_01;
  uint64_t a_02;
  _Bool _Var1;
  int iVar2;
  float32 fVar3;
  bool bVar4;
  FloatParts FVar5;
  FloatParts pr;
  FloatParts pb;
  FloatParts pa;
  float_status *status_local;
  _Bool subtract_local;
  float32 b_local;
  float32 a_local;
  int shift;
  _Bool b_sign;
  _Bool a_sign;
  uint64_t local_c0;
  int local_b8;
  FloatClass FStack_b4;
  _Bool _Stack_b3;
  undefined2 uStack_b2;
  ulong local_b0;
  int local_a8;
  FloatClass FStack_a4;
  _Bool _Stack_a3;
  undefined2 uStack_a2;
  FloatParts local_a0;
  FloatParts local_90;
  float_status *local_80;
  uint64_t local_78;
  undefined8 local_70;
  FloatParts local_68;
  float_status *local_58;
  float32 local_4c;
  FloatParts local_48;
  FloatParts local_38;
  float_status *local_28;
  float32 local_1c;
  FloatParts local_18;
  
  local_28 = status;
  local_1c = a;
  local_38 = float32_unpack_raw(a);
  FVar5 = sf_canonicalize(local_38,&float32_params,local_28);
  local_18.frac = FVar5.frac;
  a_02 = local_18.frac;
  local_58 = status;
  local_4c = b;
  local_18 = FVar5;
  local_68 = float32_unpack_raw(b);
  local_48 = sf_canonicalize(local_68,&float32_params,local_58);
  local_b0 = a_02;
  local_a8 = FVar5.exp;
  FStack_a4 = FVar5.cls;
  _Stack_a3 = FVar5.sign;
  uStack_a2 = FVar5._14_2_;
  local_c0 = local_48.frac;
  local_b8 = local_48.exp;
  FStack_b4 = local_48.cls;
  _Stack_b3 = local_48.sign;
  uStack_b2 = local_48._14_2_;
  a_local._3_1_ = (bool)(_Stack_a3 & 1);
  bVar4 = (_Bool)(_Stack_b3 & 1U) != subtract;
  if (a_local._3_1_ == bVar4) {
    if ((FStack_a4 == float_class_normal) && (FStack_b4 == float_class_normal)) {
      if (local_b8 < local_a8) {
        shift64RightJamming(local_48.frac,local_a8 - local_b8,&local_c0);
      }
      else if (local_a8 < local_b8) {
        shift64RightJamming(a_02,local_b8 - local_a8,&local_b0);
        local_a8 = local_b8;
      }
      local_b0 = local_c0 + local_b0;
      if ((local_b0 & 0x8000000000000000) != 0) {
        shift64RightJamming(local_b0,1,&local_b0);
        local_a8 = local_a8 + 1;
      }
      local_a0.cls = FStack_a4;
      local_a0.exp = local_a8;
      local_a0.sign = _Stack_a3;
      local_a0._14_2_ = uStack_a2;
      local_a0.frac = local_b0;
    }
    else {
      _Var1 = is_nan(FStack_a4);
      if ((_Var1) || (_Var1 = is_nan(FStack_b4), _Var1)) {
        a_01.exp = local_a8;
        a_01.frac = local_b0;
        a_01.cls = FStack_a4;
        a_01.sign = _Stack_a3;
        a_01._14_2_ = uStack_a2;
        FVar5.exp = local_b8;
        FVar5.frac = local_c0;
        FVar5.cls = FStack_b4;
        FVar5.sign = _Stack_b3;
        FVar5._14_2_ = uStack_b2;
        local_a0 = pick_nan(a_01,FVar5,status);
      }
      else if ((FStack_a4 == float_class_inf) || (FStack_b4 == float_class_zero)) {
        local_a0.cls = FStack_a4;
        local_a0.exp = local_a8;
        local_a0.sign = _Stack_a3;
        local_a0._14_2_ = uStack_a2;
        local_a0.frac = local_b0;
      }
      else {
        if ((FStack_b4 != float_class_inf) && (FStack_a4 != float_class_zero)) {
LAB_012ce3ef:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                     ,0x428,(char *)0x0);
        }
        local_a0.cls = FStack_b4;
        local_a0.exp = local_b8;
        local_a0.sign = bVar4;
        local_a0._14_2_ = uStack_b2;
        local_a0.frac = local_c0;
        _Stack_b3 = bVar4;
      }
    }
  }
  else if ((FStack_a4 == float_class_normal) && (FStack_b4 == float_class_normal)) {
    if ((local_b8 < local_a8) || ((local_a8 == local_b8 && (local_48.frac <= a_02)))) {
      shift64RightJamming(local_48.frac,local_a8 - local_b8,&local_c0);
      local_b0 = local_b0 - local_c0;
    }
    else {
      shift64RightJamming(a_02,local_b8 - local_a8,&local_b0);
      local_b0 = local_c0 - local_b0;
      local_a8 = local_b8;
      a_local._3_1_ = a_local._3_1_ != true;
    }
    if (local_b0 == 0) {
      FStack_a4 = float_class_zero;
      _Stack_a3 = status->float_rounding_mode == '\x01';
    }
    else {
      iVar2 = clz64(local_b0);
      local_b0 = local_b0 << ((byte)(iVar2 + -1) & 0x3f);
      local_a8 = local_a8 - (iVar2 + -1);
      _Stack_a3 = a_local._3_1_;
    }
    local_a0.cls = FStack_a4;
    local_a0.exp = local_a8;
    local_a0.sign = _Stack_a3;
    local_a0._14_2_ = uStack_a2;
    local_a0.frac = local_b0;
  }
  else {
    _Var1 = is_nan(FStack_a4);
    if ((_Var1) || (_Var1 = is_nan(FStack_b4), _Var1)) {
      a_00.exp = local_a8;
      a_00.frac = local_b0;
      a_00.cls = FStack_a4;
      a_00.sign = _Stack_a3;
      a_00._14_2_ = uStack_a2;
      b_00.exp = local_b8;
      b_00.frac = local_c0;
      b_00.cls = FStack_b4;
      b_00.sign = _Stack_b3;
      b_00._14_2_ = uStack_b2;
      local_a0 = pick_nan(a_00,b_00,status);
    }
    else if (FStack_a4 == float_class_inf) {
      if (FStack_b4 == float_class_inf) {
        float_raise_tricore('\x01',status);
        local_a0 = parts_default_nan(status);
      }
      else {
        local_a0.cls = 3;
        local_a0.exp = local_a8;
        local_a0.sign = _Stack_a3;
        local_a0._14_2_ = uStack_a2;
        local_a0.frac = local_b0;
      }
    }
    else if ((FStack_a4 == float_class_zero) && (FStack_b4 == float_class_zero)) {
      _Stack_a3 = status->float_rounding_mode == '\x01';
      local_a0.cls = 1;
      local_a0.exp = local_a8;
      local_a0.sign = _Stack_a3;
      local_a0._14_2_ = uStack_a2;
      local_a0.frac = local_b0;
    }
    else if ((FStack_a4 == float_class_zero) || (FStack_b4 == float_class_inf)) {
      local_a0.cls = FStack_b4;
      local_a0.exp = local_b8;
      local_a0.sign = a_local._3_1_ != true;
      local_a0._14_2_ = uStack_b2;
      local_a0.frac = local_c0;
      _Stack_b3 = a_local._3_1_ != true;
    }
    else {
      if (FStack_b4 != float_class_zero) goto LAB_012ce3ef;
      local_a0.cls = FStack_a4;
      local_a0.exp = local_a8;
      local_a0.sign = _Stack_a3;
      local_a0._14_2_ = uStack_a2;
      local_a0.frac = local_b0;
    }
  }
  FVar5 = local_a0;
  local_78 = local_a0.frac;
  local_70._0_4_ = local_a0.exp;
  local_70._4_1_ = local_a0.cls;
  local_70._5_1_ = local_a0.sign;
  local_70._6_2_ = local_a0._14_2_;
  local_a0 = FVar5;
  local_80 = status;
  local_90 = round_canonical(FVar5,status,&float32_params);
  fVar3 = float32_pack_raw(local_90);
  return fVar3;
}

Assistant:

static float32 QEMU_SOFTFLOAT_ATTR
soft_f32_addsub(float32 a, float32 b, bool subtract, float_status *status)
{
    FloatParts pa = float32_unpack_canonical(a, status);
    FloatParts pb = float32_unpack_canonical(b, status);
    FloatParts pr = addsub_floats(pa, pb, subtract, status);

    return float32_round_pack_canonical(pr, status);
}